

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O0

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::initParameters
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  ParameterSet *pPVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  NonIterativeFeaturePreservingMeshFiltering *local_10;
  NonIterativeFeaturePreservingMeshFiltering *this_local;
  
  local_10 = this;
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"sigma_f/mean_edge_length",&local_31);
  ParameterSet::addParameter(pPVar1,(string *)local_30,1.0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"sigma_g/mean_edge_length",&local_69);
  ParameterSet::addParameter(pPVar1,(string *)local_68,1.0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("sigma_f/mean_edge_length"), 1.0);
    parameter_set_->addParameter(string("sigma_g/mean_edge_length"), 1.0);

}